

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_dense.c
# Opt level: O3

int check_vector(N_Vector X,N_Vector Y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  prVar1 = N_VGetArrayPointer(X);
  prVar2 = N_VGetArrayPointer(Y);
  lVar3 = N_VGetLength_Serial(X);
  if (0 < lVar3) {
    iVar4 = 0;
    lVar5 = 0;
    do {
      if (NAN(prVar1[lVar5])) {
        uVar6 = 1;
      }
      else {
        uVar6 = (uint)(tol < ABS(prVar1[lVar5] - prVar2[lVar5]));
      }
      iVar4 = iVar4 + uVar6;
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
    if (iVar4 != 0) {
      if (lVar3 < 1) {
        dVar7 = 0.0;
      }
      else {
        lVar5 = 0;
        dVar8 = 0.0;
        do {
          dVar7 = ABS(prVar1[lVar5] - prVar2[lVar5]);
          if (ABS(prVar1[lVar5] - prVar2[lVar5]) <= dVar8) {
            dVar7 = dVar8;
          }
          lVar5 = lVar5 + 1;
          dVar8 = dVar7;
        } while (lVar3 != lVar5);
      }
      printf("check err failure: maxerr = %g (tol = %g)\n",dVar7);
      return 1;
    }
  }
  return 0;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, realtype tol)
{
  int failure = 0;
  sunindextype i, local_length;
  realtype *Xdata, *Ydata, maxerr;
  
  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);
  local_length = N_VGetLength_Serial(X);
  
  /* check vector data */
  for(i=0; i < local_length; i++)
    failure += FNEQ(Xdata[i], Ydata[i], tol);

  if (failure > ZERO) {
    maxerr = ZERO;
    for(i=0; i < local_length; i++)
      maxerr = SUNMAX(SUNRabs(Xdata[i]-Ydata[i]), maxerr);
    printf("check err failure: maxerr = %g (tol = %g)\n",
	   maxerr, tol);
    return(1);
  }
  else
    return(0);
}